

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

void __thiscall ncnn::Mat::to_pixels(Mat *this,uchar *pixels,int type,int stride)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  int iVar9;
  int iVar10;
  int remain_7;
  uchar uVar11;
  int remain_1;
  int iVar12;
  float *pfVar13;
  Mat local_78;
  
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      iVar1 = this->w;
      iVar6 = this->h;
      iVar2 = iVar1 * -3 + stride;
      iVar9 = 0;
      iVar3 = 0;
      if (0 < iVar6) {
        iVar3 = iVar6;
      }
      iVar4 = 1;
      if (iVar2 == 0) {
        iVar3 = iVar4;
        iVar4 = iVar6;
      }
      channel(&local_78,this,0);
      pfVar7 = (float *)local_78.data;
      ~Mat(&local_78);
      channel(&local_78,this,1);
      pfVar13 = (float *)local_78.data;
      ~Mat(&local_78);
      channel(&local_78,this,2);
      pfVar8 = (float *)local_78.data;
      ~Mat(&local_78);
      puVar5 = pixels;
      for (iVar6 = 0; iVar12 = iVar4 * iVar1, iVar6 != iVar3; iVar6 = iVar6 + 1) {
        for (; 0 < iVar12; iVar12 = iVar12 + -1) {
          iVar10 = (int)*pfVar7;
          if ((int)*pfVar7 < 1) {
            iVar10 = iVar9;
          }
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          *puVar5 = (uchar)iVar10;
          iVar10 = (int)*pfVar13;
          if ((int)*pfVar13 < 1) {
            iVar10 = iVar9;
          }
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          puVar5[1] = (uchar)iVar10;
          iVar10 = (int)*pfVar8;
          if ((int)*pfVar8 < 1) {
            iVar10 = iVar9;
          }
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          puVar5[2] = (uchar)iVar10;
          puVar5 = puVar5 + 3;
          pfVar7 = pfVar7 + 1;
          pfVar13 = pfVar13 + 1;
          pfVar8 = pfVar8 + 1;
        }
        puVar5 = puVar5 + iVar2;
      }
    }
    if (type == 3) {
      iVar1 = this->w;
      iVar6 = this->h;
      iVar3 = 0;
      if (0 < iVar6) {
        iVar3 = iVar6;
      }
      iVar9 = stride - iVar1;
      iVar2 = 1;
      if (iVar9 == 0) {
        iVar3 = iVar2;
        iVar2 = iVar6;
      }
      pfVar7 = (float *)this->data;
      puVar5 = pixels;
      for (iVar6 = 0; iVar4 = iVar2 * iVar1, iVar6 != iVar3; iVar6 = iVar6 + 1) {
        for (; 0 < iVar4; iVar4 = iVar4 + -1) {
          iVar12 = (int)*pfVar7;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          *puVar5 = (uchar)iVar12;
          puVar5 = puVar5 + 1;
          pfVar7 = pfVar7 + 1;
        }
        puVar5 = puVar5 + iVar9;
      }
    }
    if ((type & 0xfffeU) != 4) {
      return;
    }
    iVar1 = this->w;
    iVar6 = this->h;
    iVar3 = 0;
    if (0 < iVar6) {
      iVar3 = iVar6;
    }
    iVar9 = stride + iVar1 * -4;
    iVar2 = 1;
    if (iVar9 == 0) {
      iVar3 = iVar2;
      iVar2 = iVar6;
    }
    channel(&local_78,this,0);
    pfVar7 = (float *)local_78.data;
    ~Mat(&local_78);
    channel(&local_78,this,1);
    pfVar13 = (float *)local_78.data;
    ~Mat(&local_78);
    channel(&local_78,this,2);
    pfVar8 = (float *)local_78.data;
    ~Mat(&local_78);
    channel(&local_78,this,3);
    ~Mat(&local_78);
    for (iVar6 = 0; iVar4 = iVar2 * iVar1, iVar6 != iVar3; iVar6 = iVar6 + 1) {
      for (; 0 < iVar4; iVar4 = iVar4 + -1) {
        iVar12 = (int)*pfVar7;
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        *pixels = (uchar)iVar12;
        iVar12 = (int)*pfVar13;
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        pixels[1] = (uchar)iVar12;
        iVar12 = (int)*pfVar8;
        if ((int)*pfVar8 < 1) {
          iVar12 = 0;
        }
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        pixels[2] = (uchar)iVar12;
        iVar12 = (int)*local_78.data;
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        pixels[3] = (uchar)iVar12;
        pixels = pixels + 4;
        pfVar7 = pfVar7 + 1;
        pfVar13 = pfVar13 + 1;
        pfVar8 = pfVar8 + 1;
        local_78.data = (void *)((long)local_78.data + 4);
      }
      pixels = pixels + iVar9;
    }
    return;
  }
  switch(type) {
  case 0x40001:
switchD_00140b87_caseD_50002:
    iVar1 = this->w;
    iVar6 = this->h;
    iVar2 = 0;
    iVar3 = 0;
    if (0 < iVar6) {
      iVar3 = iVar6;
    }
    iVar4 = stride + iVar1 * -4;
    iVar9 = 1;
    if (iVar4 == 0) {
      iVar3 = iVar9;
      iVar9 = iVar6;
    }
    channel(&local_78,this,0);
    pfVar7 = (float *)local_78.data;
    ~Mat(&local_78);
    channel(&local_78,this,1);
    pfVar13 = (float *)local_78.data;
    ~Mat(&local_78);
    channel(&local_78,this,2);
    ~Mat(&local_78);
    for (iVar6 = 0; iVar12 = iVar9 * iVar1, iVar6 != iVar3; iVar6 = iVar6 + 1) {
      for (; 0 < iVar12; iVar12 = iVar12 + -1) {
        iVar10 = (int)*pfVar7;
        if ((int)*pfVar7 < 1) {
          iVar10 = iVar2;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        *pixels = (uchar)iVar10;
        iVar10 = (int)*pfVar13;
        if ((int)*pfVar13 < 1) {
          iVar10 = iVar2;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pixels[1] = (uchar)iVar10;
        iVar10 = (int)*local_78.data;
        if ((int)*local_78.data < 1) {
          iVar10 = iVar2;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pixels[2] = (uchar)iVar10;
        pixels[3] = 0xff;
        pixels = pixels + 4;
        pfVar7 = pfVar7 + 1;
        pfVar13 = pfVar13 + 1;
        local_78.data = (void *)((long)local_78.data + 4);
      }
      pixels = pixels + iVar4;
    }
    break;
  case 0x40002:
switchD_00140b87_caseD_50001:
    iVar1 = this->w;
    iVar6 = this->h;
    iVar2 = 0;
    iVar3 = 0;
    if (0 < iVar6) {
      iVar3 = iVar6;
    }
    iVar4 = stride + iVar1 * -4;
    iVar9 = 1;
    if (iVar4 == 0) {
      iVar3 = iVar9;
      iVar9 = iVar6;
    }
    channel(&local_78,this,0);
    pfVar7 = (float *)local_78.data;
    ~Mat(&local_78);
    channel(&local_78,this,1);
    pfVar13 = (float *)local_78.data;
    ~Mat(&local_78);
    channel(&local_78,this,2);
    ~Mat(&local_78);
    for (iVar6 = 0; iVar12 = iVar9 * iVar1, iVar6 != iVar3; iVar6 = iVar6 + 1) {
      for (; 0 < iVar12; iVar12 = iVar12 + -1) {
        iVar10 = (int)*local_78.data;
        if ((int)*local_78.data < 1) {
          iVar10 = iVar2;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        *pixels = (uchar)iVar10;
        iVar10 = (int)*pfVar13;
        if ((int)*pfVar13 < 1) {
          iVar10 = iVar2;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pixels[1] = (uchar)iVar10;
        iVar10 = (int)*pfVar7;
        if ((int)*pfVar7 < 1) {
          iVar10 = iVar2;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pixels[2] = (uchar)iVar10;
        pixels[3] = 0xff;
        pixels = pixels + 4;
        pfVar7 = pfVar7 + 1;
        pfVar13 = pfVar13 + 1;
        local_78.data = (void *)((long)local_78.data + 4);
      }
      pixels = pixels + iVar4;
    }
    break;
  case 0x40003:
switchD_00140b87_caseD_50003:
    iVar1 = this->w;
    iVar6 = this->h;
    iVar3 = 0;
    if (0 < iVar6) {
      iVar3 = iVar6;
    }
    iVar9 = stride + iVar1 * -4;
    iVar2 = 1;
    if (iVar9 == 0) {
      iVar3 = iVar2;
      iVar2 = iVar6;
    }
    pfVar7 = (float *)this->data;
    for (iVar6 = 0; iVar4 = iVar2 * iVar1, iVar6 != iVar3; iVar6 = iVar6 + 1) {
      for (; 0 < iVar4; iVar4 = iVar4 + -1) {
        iVar12 = (int)*pfVar7;
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        uVar11 = (uchar)iVar12;
        *pixels = uVar11;
        pixels[1] = uVar11;
        pixels[2] = uVar11;
        pixels[3] = 0xff;
        pixels = pixels + 4;
        pfVar7 = pfVar7 + 1;
      }
      pixels = pixels + iVar9;
    }
    return;
  case 0x40004:
switchD_00140d81_caseD_40004:
    fprintf(_stderr,"unimplemented convert type %d");
    fputc(10,_stderr);
    return;
  case 0x40005:
switchD_00140b87_caseD_50004:
    iVar1 = this->w;
    iVar6 = this->h;
    iVar2 = 0;
    iVar3 = 0;
    if (0 < iVar6) {
      iVar3 = iVar6;
    }
    iVar4 = stride + iVar1 * -4;
    iVar9 = 1;
    if (iVar4 == 0) {
      iVar3 = iVar9;
      iVar9 = iVar6;
    }
    channel(&local_78,this,0);
    pfVar7 = (float *)local_78.data;
    ~Mat(&local_78);
    channel(&local_78,this,1);
    pfVar13 = (float *)local_78.data;
    ~Mat(&local_78);
    channel(&local_78,this,2);
    pfVar8 = (float *)local_78.data;
    ~Mat(&local_78);
    channel(&local_78,this,3);
    ~Mat(&local_78);
    for (iVar6 = 0; iVar12 = iVar9 * iVar1, iVar6 != iVar3; iVar6 = iVar6 + 1) {
      for (; 0 < iVar12; iVar12 = iVar12 + -1) {
        iVar10 = (int)*pfVar8;
        if ((int)*pfVar8 < 1) {
          iVar10 = iVar2;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        *pixels = (uchar)iVar10;
        iVar10 = (int)*pfVar13;
        if ((int)*pfVar13 < 1) {
          iVar10 = iVar2;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pixels[1] = (uchar)iVar10;
        iVar10 = (int)*pfVar7;
        if ((int)*pfVar7 < 1) {
          iVar10 = iVar2;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pixels[2] = (uchar)iVar10;
        iVar10 = (int)*local_78.data;
        if ((int)*local_78.data < 1) {
          iVar10 = iVar2;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pixels[3] = (uchar)iVar10;
        pixels = pixels + 4;
        pfVar7 = pfVar7 + 1;
        pfVar13 = pfVar13 + 1;
        pfVar8 = pfVar8 + 1;
        local_78.data = (void *)((long)local_78.data + 4);
      }
      pixels = pixels + iVar4;
    }
    return;
  default:
    switch(type) {
    case 0x50001:
      goto switchD_00140b87_caseD_50001;
    case 0x50002:
      goto switchD_00140b87_caseD_50002;
    case 0x50003:
      goto switchD_00140b87_caseD_50003;
    case 0x50004:
      goto switchD_00140b87_caseD_50004;
    default:
      if ((type == 0x20001) || (type == 0x10002)) {
        iVar1 = this->w;
        iVar6 = this->h;
        iVar2 = iVar1 * -3 + stride;
        iVar9 = 0;
        iVar3 = 0;
        if (0 < iVar6) {
          iVar3 = iVar6;
        }
        iVar4 = 1;
        if (iVar2 == 0) {
          iVar3 = 1;
          iVar4 = iVar6;
        }
        channel(&local_78,this,0);
        pfVar7 = (float *)local_78.data;
        ~Mat(&local_78);
        channel(&local_78,this,1);
        pfVar13 = (float *)local_78.data;
        ~Mat(&local_78);
        channel(&local_78,this,2);
        ~Mat(&local_78);
        for (iVar6 = 0; iVar12 = iVar4 * iVar1, iVar6 != iVar3; iVar6 = iVar6 + 1) {
          for (; 0 < iVar12; iVar12 = iVar12 + -1) {
            iVar10 = (int)*pfVar7;
            if ((int)*pfVar7 < 1) {
              iVar10 = iVar9;
            }
            if (0xfe < iVar10) {
              iVar10 = 0xff;
            }
            pixels[2] = (uchar)iVar10;
            iVar10 = (int)*pfVar13;
            if ((int)*pfVar13 < 1) {
              iVar10 = iVar9;
            }
            if (0xfe < iVar10) {
              iVar10 = 0xff;
            }
            pixels[1] = (uchar)iVar10;
            iVar10 = (int)*local_78.data;
            if ((int)*local_78.data < 1) {
              iVar10 = iVar9;
            }
            if (0xfe < iVar10) {
              iVar10 = 0xff;
            }
            *pixels = (uchar)iVar10;
            pixels = pixels + 3;
            pfVar7 = pfVar7 + 1;
            pfVar13 = pfVar13 + 1;
            local_78.data = (void *)((long)local_78.data + 4);
          }
          pixels = pixels + iVar2;
        }
        return;
      }
      goto switchD_00140d81_caseD_40004;
    }
  }
  return;
}

Assistant:

void Mat::to_pixels(unsigned char* pixels, int type, int stride) const
{
    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            to_bgr2rgb(*this, pixels, stride);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            to_rgb2rgba(*this, pixels, stride);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            to_bgr2rgba(*this, pixels, stride);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            to_gray2rgba(*this, pixels, stride);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            to_rgba2bgra(*this, pixels, stride);
            break;
        default:
            // unimplemented convert type
            NCNN_LOGE("unimplemented convert type %d", type);
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            to_rgb(*this, pixels, stride);

        if (type == PIXEL_GRAY)
            to_gray(*this, pixels, stride);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            to_rgba(*this, pixels, stride);
    }
}